

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O3

void __thiscall
OmegaOP::algoSMOOTHING(OmegaOP *this,vector<double,_std::allocator<double>_> *data,double minAngle)

{
  pointer pdVar1;
  pointer pdVar2;
  double *pdVar3;
  ulong uVar4;
  bool bVar5;
  double **ppdVar6;
  ulong uVar7;
  ulong uVar8;
  uint u;
  ulong uVar9;
  uint uVar10;
  double dVar11;
  Costs cost;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  double local_68;
  ulong local_60;
  double minAngle_local;
  ulong local_50;
  double *local_48;
  double local_40;
  ulong local_38;
  
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_60 = (ulong)this->nbStates;
  minAngle_local = minAngle;
  Costs::Costs(&cost);
  ppdVar6 = preprocessing(this,data);
  this->S12P = ppdVar6;
  uVar10 = (int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3) + 1;
  local_50 = (ulong)uVar10;
  local_78 = 2;
  if (2 < uVar10) {
    do {
      if (local_60 != 0) {
        local_38 = 0;
        do {
          local_74 = 1;
          local_6c = 0;
          local_68 = INFINITY;
          local_70 = 0;
          if (1 < local_78) {
            uVar9 = 0;
            local_70 = 0;
            local_6c = 0;
            local_68 = INFINITY;
            do {
              do {
                uVar4 = local_38;
                pdVar3 = this->states;
                bVar5 = Costs::angleTest(&cost,this->lastChpt[uVar9] + local_74,&local_74,&local_78,
                                         pdVar3 + this->lastIndState[uVar9][local_74],pdVar3 + uVar9
                                         ,pdVar3 + local_38,&minAngle_local);
                if (bVar5) {
                  uVar7 = (ulong)local_74;
                  local_40 = this->Q[uVar9][uVar7];
                  ppdVar6 = this->S12P;
                  uVar8 = (ulong)local_78;
                  local_48 = ppdVar6[1] + uVar7;
                  dVar11 = Costs::slopeCost(&cost,this->states + uVar9,this->states + uVar4,
                                            &local_74,&local_78,*ppdVar6 + uVar7,*ppdVar6 + uVar8,
                                            local_48,ppdVar6[1] + uVar8,ppdVar6[2] + uVar7,
                                            ppdVar6[2] + uVar8);
                  dVar11 = dVar11 + local_40 + this->penalty;
                  if (dVar11 < local_68) {
                    local_6c = local_74;
                    local_70 = (uint)uVar9;
                    local_68 = dVar11;
                  }
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != local_60);
              local_74 = local_74 + 1;
              uVar9 = 0;
            } while (local_74 < local_78);
          }
          this->Q[local_38][local_78] = local_68;
          this->lastChpt[local_38][local_78] = local_6c;
          this->lastIndState[local_38][local_78] = local_70;
          local_38 = local_38 + 1;
        } while (local_38 != local_60);
      }
      local_78 = local_78 + 1;
    } while (local_78 < (uint)local_50);
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaOP::algoSMOOTHING(std::vector< double >& data, double minAngle)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          if(cost.angleTest(lastChpt[u][t], t, T, states[lastIndState[u][t]], states[u], states[v], minAngle))
          {
            temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
            //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
          //std::cout << std::endl;
        }

      }
      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }
  pruning = 1;

}